

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O3

void amrex::MLLinOp::makeAgglomeratedDMap
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *ba,
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *dm)

{
  long *plVar1;
  int *piVar2;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pVVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  Vector<int,_std::allocator<int>_> pmap;
  allocator_type local_79;
  ulong local_78;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *local_70;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_68;
  vector<int,_std::allocator<int>_> local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  uVar6 = (int)((long)(ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3b13b13b;
  if (1 < (int)uVar6) {
    uVar8 = (ulong)(uVar6 & 0x7fffffff);
    uVar7 = 1;
    local_78 = uVar8;
    local_70 = dm;
    local_68 = ba;
    do {
      pVVar3 = local_68;
      plVar1 = *(long **)&(dm->
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ).
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].m_ref.
                          super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
      ;
      if (*plVar1 == plVar1[1]) {
        DistributionMapping::makeSFC
                  (&local_48,
                   (local_68->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar7,true,*(int *)(DAT_0071a620 + -0x38));
        uVar6 = *(uint *)(DAT_0071a620 + -0x38);
        plVar1 = *(long **)&(pVVar3->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                            ).super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar7].m_ref.
                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_60,(plVar1[1] - *plVar1 >> 2) * 0x6db6db6db6db6db7,&local_79);
        if (0 < (int)uVar6) {
          uVar8 = 0;
          do {
            iVar4 = ParallelContext::Frame::local_to_global_rank
                              ((Frame *)(DAT_0071a620 + -0x48),(int)uVar8);
            piVar2 = local_48.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
            for (piVar5 = local_48.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[*piVar5] = iVar4;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar6);
        }
        dm = local_70;
        DistributionMapping::define
                  ((local_70->
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ).
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar7,
                   (Vector<int,_std::allocator<int>_> *)&local_60);
        if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_48);
        uVar8 = local_78;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

Any
MLLinOp::AnyMakeCoarseAmr (int famrlev, IntVect const& ng) const
{
    BoxArray cba = m_grids[famrlev][0];
    IntVect ratio(AMRRefRatio(famrlev-1));
    cba.coarsen(ratio);
    cba.convert(m_ixtype);
    return Any(MultiFab(cba, m_dmap[famrlev][0], getNComp(), ng));
}